

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

void __thiscall
spv::Builder::endSwitch(Builder *this,vector<spv::Block_*,_std::allocator<spv::Block_*>_> *param_1)

{
  Block **ppBVar1;
  bool bVar2;
  _Elt_pointer ppBVar3;
  _Elt_pointer ppBVar4;
  
  bVar2 = Block::isTerminated(this->buildPoint);
  if (!bVar2) {
    addSwitchBreak(this,true);
  }
  ppBVar3 = (this->switchMerges).c.super__Deque_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppBVar3 ==
      (this->switchMerges).c.super__Deque_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppBVar1 = (this->switchMerges).c.super__Deque_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1];
    ppBVar4 = ppBVar1 + 0x3f;
    ppBVar3 = ppBVar1 + 0x40;
  }
  else {
    ppBVar4 = ppBVar3 + -1;
  }
  spv::Function::addBlock((*ppBVar4)->parent,ppBVar3[-1]);
  ppBVar3 = (this->switchMerges).c.super__Deque_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppBVar3 ==
      (this->switchMerges).c.super__Deque_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppBVar3 = (this->switchMerges).c.super__Deque_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  this->buildPoint = ppBVar3[-1];
  this->dirtyLineTracker = true;
  this->dirtyScopeTracker = true;
  std::deque<spv::Block_*,_std::allocator<spv::Block_*>_>::pop_back(&(this->switchMerges).c);
  return;
}

Assistant:

void Builder::endSwitch(std::vector<Block*>& /*segmentBlock*/)
{
    // Close out previous segment by jumping, if necessary, to next segment
    if (! buildPoint->isTerminated())
        addSwitchBreak(true);

    switchMerges.top()->getParent().addBlock(switchMerges.top());
    setBuildPoint(switchMerges.top());

    switchMerges.pop();
}